

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::getUri(Scope *this,XMLCh *prefix)

{
  char16_t *pcVar1;
  
  do {
    if (this->fPrefixHash != (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
      pcVar1 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this->fPrefixHash,prefix);
      return pcVar1;
    }
    this = this->fBaseScopeWithBindings;
  } while (this != (Scope *)0x0);
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* DOMNormalizer::InScopeNamespaces::Scope::getUri(const XMLCh *prefix) const {
    const XMLCh* uri = 0;

    if(fPrefixHash) {
        uri = fPrefixHash->get(prefix);
    }
    else if(fBaseScopeWithBindings) {
        uri = fBaseScopeWithBindings->getUri(prefix);
    }

    return uri ? uri : 0;
}